

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O1

void __thiscall
Qentem::BigInt<unsigned_long_long,_1024U>::Add
          (BigInt<unsigned_long_long,_1024U> *this,unsigned_long_long number,SizeT32 index)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  if (number != 0) {
    uVar6 = (ulong)index;
    uVar4 = 0x10;
    if (0x10 < index) {
      uVar4 = (ulong)index;
    }
    iVar7 = 1 - index;
    while (uVar4 != uVar6) {
      uVar2 = this->storage_[uVar6];
      uVar1 = uVar2 + number;
      this->storage_[uVar6] = uVar1;
      uVar6 = uVar6 + 1;
      if (uVar2 < uVar1) {
        uVar4 = (ulong)-(iVar7 + -2 + (uint)(uVar2 < uVar1));
        break;
      }
      number = 1;
      iVar7 = iVar7 + -1;
    }
    uVar3 = (uint)uVar4;
    uVar5 = 0;
    if ((0xf < uVar3) || (uVar5 = uVar3, this->index_ < uVar3)) {
      this->index_ = uVar5;
    }
  }
  return;
}

Assistant:

void Add(Number_T number, SizeT32 index = 0U) noexcept {
        if (number != 0) {
            while (index <= MaxIndex()) {
                const Number_T tmp = storage_[index];
                storage_[index] += number;

                if (storage_[index] > tmp) {
                    break;
                }

                // Overflow.
                number = Number_T{1};
                ++index;
            }

            if (index > MaxIndex()) {
                index_ = 0;
            } else if (index > index_) {
                index_ = index;
            }
        }
    }